

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint32_t farmhash32(char *s,size_t len)

{
  uint uVar1;
  uint64_t uVar2;
  
  uVar2 = farmhash64_te(s,len);
  uVar1 = ~((int)uVar2 * -0x3361d2af);
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

uint32_t farmhash32(const char* s, size_t len) {
  return debug_tweak32(

#if CAN_USE_SSE41 && x86_64
      farmhash32_nt(s, len)
#elif CAN_USE_SSE42 && CAN_USE_AESNI
      farmhash32_su(s, len)
#elif CAN_USE_SSE41 && CAN_USE_SSE42
      farmhash32_sa(s, len)
#else
      farmhash32_mk(s, len)
#endif

  );
}